

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.hpp
# Opt level: O0

signature_element *
boost::python::detail::signature_arity<4U>::
impl<boost::mpl::vector5<void,_PythonModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TrodesMsg_&>_>
::elements(void)

{
  int iVar1;
  type_info this;
  type_info *in_stack_ffffffffffffff80;
  
  if (signature_arity<4u>::
      impl<boost::mpl::vector5<void,PythonModuleClient&,std::__cxx11::string,std::__cxx11::string,TrodesMsg&>>
      ::elements()::result == '\0') {
    iVar1 = __cxa_guard_acquire(&signature_arity<4u>::
                                 impl<boost::mpl::vector5<void,PythonModuleClient&,std::__cxx11::string,std::__cxx11::string,TrodesMsg&>>
                                 ::elements()::result);
    if (iVar1 != 0) {
      type_id<void>();
      elements::result[0].basename = type_info::name(in_stack_ffffffffffffff80);
      elements::result[0].pytype_f = converter::expected_pytype_for_arg<void>::get_pytype;
      elements::result[0].lvalue = false;
      type_id<PythonModuleClient&>();
      elements::result[1].basename = type_info::name(in_stack_ffffffffffffff80);
      elements::result[1].pytype_f =
           converter::expected_pytype_for_arg<PythonModuleClient_&>::get_pytype;
      elements::result[1].lvalue = true;
      type_id<std::__cxx11::string>();
      elements::result[2].basename = type_info::name(in_stack_ffffffffffffff80);
      elements::result[2].pytype_f =
           converter::
           expected_pytype_for_arg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get_pytype;
      elements::result[2].lvalue = false;
      type_id<std::__cxx11::string>();
      elements::result[3].basename = type_info::name(in_stack_ffffffffffffff80);
      elements::result[3].pytype_f =
           converter::
           expected_pytype_for_arg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get_pytype;
      elements::result[3].lvalue = false;
      this = type_id<TrodesMsg&>();
      elements::result[4].basename = type_info::name((type_info *)this.m_base_type);
      elements::result[4].pytype_f = converter::expected_pytype_for_arg<TrodesMsg_&>::get_pytype;
      elements::result[4].lvalue = true;
      memset(elements::result + 5,0,0x18);
      __cxa_guard_release(&signature_arity<4u>::
                           impl<boost::mpl::vector5<void,PythonModuleClient&,std::__cxx11::string,std::__cxx11::string,TrodesMsg&>>
                           ::elements()::result);
    }
  }
  return elements::result;
}

Assistant:

static signature_element const* elements()
        {
            static signature_element const result[N+2] = {
                
#ifndef BOOST_PYTHON_NO_PY_SIGNATURES
# define BOOST_PP_LOCAL_MACRO(i)                                                            \
                {                                                                           \
                  type_id<BOOST_DEDUCED_TYPENAME mpl::at_c<Sig,i>::type>().name()           \
                  , &converter::expected_pytype_for_arg<BOOST_DEDUCED_TYPENAME mpl::at_c<Sig,i>::type>::get_pytype   \
                  , indirect_traits::is_reference_to_non_const<BOOST_DEDUCED_TYPENAME mpl::at_c<Sig,i>::type>::value \
                },
#else
# define BOOST_PP_LOCAL_MACRO(i)                                                            \
                {                                                                           \
                  type_id<BOOST_DEDUCED_TYPENAME mpl::at_c<Sig,i>::type>().name()           \
                  , 0 \
                  , indirect_traits::is_reference_to_non_const<BOOST_DEDUCED_TYPENAME mpl::at_c<Sig,i>::type>::value \
                },
#endif
                
# define BOOST_PP_LOCAL_LIMITS (0, N)
# include BOOST_PP_LOCAL_ITERATE()
                {0,0,0}
            };
            return result;
        }